

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O0

void WebRtcIsac_InitPitchFilter(PitchFiltstr *pitchfiltdata)

{
  int local_14;
  int k;
  PitchFiltstr *pitchfiltdata_local;
  
  for (local_14 = 0; local_14 < 0xbe; local_14 = local_14 + 1) {
    pitchfiltdata->ubuf[local_14] = 0.0;
  }
  pitchfiltdata->ystate[0] = 0.0;
  for (local_14 = 1; local_14 < 5; local_14 = local_14 + 1) {
    pitchfiltdata->ystate[local_14] = 0.0;
  }
  pitchfiltdata->oldlagp[0] = 50.0;
  pitchfiltdata->oldgainp[0] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPitchFilter(PitchFiltstr *pitchfiltdata)
{
  int k;

  for (k = 0; k < PITCH_BUFFSIZE; k++) {
    pitchfiltdata->ubuf[k] = 0.0;
  }
  pitchfiltdata->ystate[0] = 0.0;
  for (k = 1; k < (PITCH_DAMPORDER); k++) {
    pitchfiltdata->ystate[k] = 0.0;
  }
  pitchfiltdata->oldlagp[0] = 50.0;
  pitchfiltdata->oldgainp[0] = 0.0;
}